

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

string * __thiscall
t_php_generator::type_to_phpdoc_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type)

{
  int iVar1;
  t_type *ptVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  char *pcVar3;
  string *this_00;
  string local_60;
  string local_40;
  
  ptVar2 = t_type::get_true_type(type);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2), (char)iVar1 == '\0')) {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0x10])(ptVar2);
        if ((char)iVar1 != '\0') {
          pcVar3 = "array";
          goto LAB_0027e49d;
        }
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xf])(ptVar2);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xe])(ptVar2);
          if ((char)iVar1 == '\0') goto switchD_0027e47e_default;
          ptVar2 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2);
          if ((char)iVar1 == '\0') {
            type_to_phpdoc_abi_cxx11_(&local_60,this,ptVar2);
            std::operator+(__return_storage_ptr__,&local_60,"[]");
            goto LAB_0027e4f0;
          }
          type_to_phpdoc_abi_cxx11_(&local_40,this,ptVar2);
          std::operator+(&local_60,"(",&local_40);
          std::operator+(__return_storage_ptr__,&local_60,")[]");
        }
        else {
          ptVar2 = *(t_type **)&ptVar2[1].super_t_doc.has_doc_;
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2);
          if ((char)iVar1 == '\0') {
            type_to_phpdoc_abi_cxx11_(&local_60,this,ptVar2);
            std::operator+(__return_storage_ptr__,&local_60,"[]");
            goto LAB_0027e4f0;
          }
          type_to_phpdoc_abi_cxx11_(&local_40,this,ptVar2);
          std::operator+(&local_60,"(",&local_40);
          std::operator+(__return_storage_ptr__,&local_60,")[]");
        }
        std::__cxx11::string::~string((string *)&local_60);
        this_00 = &local_40;
      }
      else {
        php_namespace_abi_cxx11_(&local_60,this,ptVar2->program_);
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[3])(ptVar2);
        std::operator+(__return_storage_ptr__,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar1));
LAB_0027e4f0:
        this_00 = &local_60;
      }
      std::__cxx11::string::~string((string *)this_00);
      return __return_storage_ptr__;
    }
switchD_0027e47e_caseD_3:
    pcVar3 = "int";
  }
  else {
    switch(*(undefined4 *)&ptVar2[1].super_t_doc._vptr_t_doc) {
    case 0:
      pcVar3 = "void";
      break;
    case 1:
      pcVar3 = "string";
      break;
    case 2:
      pcVar3 = "bool";
      break;
    case 3:
    case 4:
    case 5:
    case 6:
      goto switchD_0027e47e_caseD_3;
    case 7:
      pcVar3 = "double";
      break;
    default:
switchD_0027e47e_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[3])(ptVar2);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar1));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
LAB_0027e49d:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::type_to_phpdoc(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      return "void";
    case t_base_type::TYPE_STRING:
      return "string";
    case t_base_type::TYPE_BOOL:
      return "bool";
    case t_base_type::TYPE_I8:
      return "int";
    case t_base_type::TYPE_I16:
      return "int";
    case t_base_type::TYPE_I32:
      return "int";
    case t_base_type::TYPE_I64:
      return "int";
    case t_base_type::TYPE_DOUBLE:
      return "double";
    }
  } else if (type->is_enum()) {
    return "int";
  } else if (type->is_struct() || type->is_xception()) {
    return php_namespace(type->get_program()) + type->get_name();
  } else if (type->is_map()) {
    return "array";
  } else if (type->is_set()) {
    t_set* tset = static_cast<t_set*>(type);
    t_type* t_elem = tset->get_elem_type();
    if (t_elem->is_container()) {
      return "(" + type_to_phpdoc(t_elem) + ")[]";
    } else {
      return type_to_phpdoc(t_elem) + "[]";
    }
  } else if (type->is_list()) {
    t_list* tlist = static_cast<t_list*>(type);
    t_type* t_elem = tlist->get_elem_type();
    if (t_elem->is_container()) {
      return "(" + type_to_phpdoc(t_elem) + ")[]";
    } else {
      return type_to_phpdoc(t_elem) + "[]";
    }
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}